

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

int __thiscall
cmCTestCoverageHandler::HandlePHPCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  size_t sVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string coverageDir;
  cmParsePHPCoverage cov;
  string local_60;
  string local_40;
  cmParsePHPCoverage local_20;
  
  cmParsePHPCoverage::cmParsePHPCoverage(&local_20,cont,(this->super_cmCTestGenericHandler).CTest);
  cmCTest::GetBinaryDir_abi_cxx11_(&local_40,(this->super_cmCTestGenericHandler).CTest);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_60);
  if (bVar2) {
    cmParsePHPCoverage::ReadPHPCoverageDirectory(&local_20,local_60._M_dataplus._M_p);
  }
  sVar1 = (cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (int)sVar1;
}

Assistant:

int cmCTestCoverageHandler::HandlePHPCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParsePHPCoverage cov(*cont, this->CTest);
  std::string coverageDir = this->CTest->GetBinaryDir() + "/xdebugCoverage";
  if (cmSystemTools::FileIsDirectory(coverageDir)) {
    cov.ReadPHPCoverageDirectory(coverageDir.c_str());
  }
  return static_cast<int>(cont->TotalCoverage.size());
}